

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string * archive_string_append(archive_string *as,char *p,size_t s)

{
  archive_string *paVar1;
  size_t s_local;
  char *p_local;
  archive_string *as_local;
  
  paVar1 = archive_string_ensure(as,as->length + s + 1);
  if (paVar1 == (archive_string *)0x0) {
    as_local = (archive_string *)0x0;
  }
  else {
    memmove(as->s + as->length,p,s);
    as->length = s + as->length;
    as->s[as->length] = '\0';
    as_local = as;
  }
  return as_local;
}

Assistant:

static struct archive_string *
archive_string_append(struct archive_string *as, const char *p, size_t s)
{
	if (archive_string_ensure(as, as->length + s + 1) == NULL)
		return (NULL);
	memmove(as->s + as->length, p, s);
	as->length += s;
	as->s[as->length] = 0;
	return (as);
}